

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topojson.cc
# Opt level: O2

void __thiscall topojson_t::make_coordinates(topojson_t *this,size_t topology_index)

{
  uint uVar1;
  pointer pGVar2;
  pointer pGVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  long lVar8;
  reference pvVar9;
  long lVar10;
  uint *puVar11;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__x;
  size_type sVar12;
  reference pvVar13;
  reference pvVar14;
  size_type __n;
  size_t idx;
  size_type sVar15;
  long lVar16;
  size_type __n_00;
  bool bVar17;
  vector<double,_std::allocator<double>_> xp;
  value_type local_138;
  double dStack_130;
  vector<double,_std::allocator<double>_> yp;
  arc_t arc;
  double local_c8;
  double dStack_c0;
  Geometry_t geometry;
  Polygon_topojson_t polygon;
  
  pvVar5 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                     (&this->m_topology,topology_index);
  pGVar2 = (pvVar5->m_geom).super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pGVar3 = (pvVar5->m_geom).super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  do {
    this->idx_geom = uVar7;
    if ((ulong)(((long)pGVar2 - (long)pGVar3) / 0x38) <= uVar7) {
      return;
    }
    pvVar5 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                       (&this->m_topology,topology_index);
    pvVar6 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                       (&pvVar5->m_geom,this->idx_geom);
    Geometry_t::Geometry_t(&geometry,pvVar6);
    iVar4 = std::__cxx11::string::compare((char *)&geometry);
    if (iVar4 == 0) {
LAB_00106fd1:
      lVar8 = (long)geometry.m_polygon.
                    super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)geometry.m_polygon.
                    super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      for (__n = 0; __n != lVar8 / 0x48; __n = __n + 1) {
        pvVar9 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                           (&geometry.m_polygon,__n);
        Polygon_topojson_t::Polygon_topojson_t(&polygon,pvVar9);
        lVar10 = (long)polygon.arcs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)polygon.arcs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        for (__n_00 = 0; __n_00 != lVar10 >> 2; __n_00 = __n_00 + 1) {
          puVar11 = (uint *)std::vector<int,_std::allocator<int>_>::at(&polygon.arcs,__n_00);
          uVar1 = *puVar11;
          __x = &std::vector<arc_t,_std::allocator<arc_t>_>::at
                           (&this->m_arcs,(long)(int)((int)uVar1 >> 0x1f ^ uVar1))->vec;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::vector(&arc.vec,__x);
          sVar12 = ((long)arc.vec.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)arc.vec.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18;
          xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_c8 = 0.0;
          dStack_c0 = 0.0;
          for (sVar15 = 0; sVar12 != sVar15; sVar15 = sVar15 + 1) {
            pvVar13 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::at(&arc.vec,sVar15);
            pvVar14 = std::vector<double,_std::allocator<double>_>::at(pvVar13,0);
            local_138 = *pvVar14;
            pvVar13 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::at(&arc.vec,sVar15);
            pvVar14 = std::vector<double,_std::allocator<double>_>::at(pvVar13,1);
            local_c8 = local_c8 + local_138;
            dStack_c0 = dStack_c0 + *pvVar14;
            local_138 = this->scale[0] * local_c8 + this->translate[0];
            dStack_130 = this->scale[1] * dStack_c0 + this->translate[1];
            std::vector<double,_std::allocator<double>_>::push_back(&xp,&local_138);
            std::vector<double,_std::allocator<double>_>::push_back(&yp,&dStack_130);
          }
          if ((int)uVar1 < 0) {
            lVar16 = sVar12 * 8;
            sVar15 = sVar12;
            while( true ) {
              lVar16 = lVar16 + -8;
              bVar17 = sVar15 == 0;
              sVar15 = sVar15 - 1;
              if (bVar17) break;
              pvVar5 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                                 (&this->m_topology,topology_index);
              pvVar6 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                                 (&pvVar5->m_geom,this->idx_geom);
              pvVar9 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (&pvVar6->m_polygon,__n);
              std::vector<double,_std::allocator<double>_>::push_back
                        (&pvVar9->m_x,
                         (value_type_conflict2 *)
                         ((long)xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar16));
              pvVar5 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                                 (&this->m_topology,topology_index);
              pvVar6 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                                 (&pvVar5->m_geom,this->idx_geom);
              pvVar9 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (&pvVar6->m_polygon,__n);
              std::vector<double,_std::allocator<double>_>::push_back
                        (&pvVar9->m_y,
                         (value_type_conflict2 *)
                         ((long)yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar16));
            }
          }
          else {
            lVar16 = 0;
            sVar15 = sVar12;
            while (bVar17 = sVar15 != 0, sVar15 = sVar15 - 1, bVar17) {
              pvVar5 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                                 (&this->m_topology,topology_index);
              pvVar6 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                                 (&pvVar5->m_geom,this->idx_geom);
              pvVar9 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (&pvVar6->m_polygon,__n);
              std::vector<double,_std::allocator<double>_>::push_back
                        (&pvVar9->m_x,
                         (value_type_conflict2 *)
                         ((long)xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar16));
              pvVar5 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                                 (&this->m_topology,topology_index);
              pvVar6 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                                 (&pvVar5->m_geom,this->idx_geom);
              pvVar9 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (&pvVar6->m_polygon,__n);
              std::vector<double,_std::allocator<double>_>::push_back
                        (&pvVar9->m_y,
                         (value_type_conflict2 *)
                         ((long)yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar16));
              lVar16 = lVar16 + 8;
            }
          }
          if ((long)xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3 != sVar12) {
            __assert_fail("xp.size() == size_vec_arcs",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/pedro-vicente[P]lib_topojson/topojson.cc"
                          ,0x1fe,"void topojson_t::make_coordinates(size_t)");
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&yp.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&xp.super__Vector_base<double,_std::allocator<double>_>);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&arc.vec);
        }
        Polygon_topojson_t::~Polygon_topojson_t(&polygon);
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&geometry);
      if (iVar4 == 0) goto LAB_00106fd1;
    }
    Geometry_t::~Geometry_t(&geometry);
    uVar7 = this->idx_geom + 1;
  } while( true );
}

Assistant:

void topojson_t::make_coordinates(size_t topology_index)
{
  size_t size_geom = m_topology.at(topology_index).m_geom.size();
  for (idx_geom = 0; idx_geom < size_geom; idx_geom++)
  {
    Geometry_t geometry = m_topology.at(topology_index).m_geom.at(idx_geom);
    if (geometry.type.compare("Polygon") == 0 || geometry.type.compare("MultiPolygon") == 0)
    {
      size_t size_pol = geometry.m_polygon.size();
      for (size_t idx_pol = 0; idx_pol < size_pol; idx_pol++)
      {
        Polygon_topojson_t polygon = geometry.m_polygon.at(idx_pol);
        size_t size_arcs = polygon.arcs.size();

        for (size_t idx_arc = 0; idx_arc < size_arcs; idx_arc++)
        {
          int index = polygon.arcs.at(idx_arc);
          int index_q = index < 0 ? ~index : index;
          arc_t arc = m_arcs.at(index_q);
          size_t size_vec_arcs = arc.vec.size();
          //if a topology is quantized, the positions of each arc in the topology which are quantized 
          //must be delta-encoded. The first position of the arc is a normal position [x1, y1]. 
          //The second position [x2, y2] is encoded as [dx2, dy2], where 
          //x2 = x1 + dx2 and 
          //y2 = y1 + dx2.
          //The third position [x3, y3] is encoded as [dx3, dy3], where 
          //x3 = x2 + dx3 = x1 + dx2 + dx3 and
          //y3 = y2 + dy3 = y1 + dy2 + dy3 and so on.
          double x = 0;
          double y = 0;
          //temporary positions
          std::vector<double> xp;
          std::vector<double> yp;
          for (size_t idx = 0; idx < size_vec_arcs; idx++)
          {
            double position[2];
            position[0] = arc.vec.at(idx).at(0);
            position[1] = arc.vec.at(idx).at(1);
            position[0] = (x += position[0]) * scale[0] + translate[0];
            position[1] = (y += position[1]) * scale[1] + translate[1];
            xp.push_back(position[0]);
            yp.push_back(position[1]);
          }//size_vec_arcs

          //@mbostock
          //TopoJSON allows you to reference a reversed arc in a geometry so that when geometries share an arc, 
          //but some geometries need the arc in the opposite direction, the geometries can reference the same arc.
          //This occurs very commonly when you have neighboring geometries.For example, California and Nevada 
          //share a border, but given that both would typically have the same winding order, 
          //the shared border must be reversed between the two polygons if you want to share the arc.
          //A reversed arc means that rather than the arc�s points going p_0, p_1, � p_n, 
          //the points go p_n, p_{ n - 1 }, � p_0.

           //reverse the subsequences of points represented by the negative arc indexes
          if (index < 0)
          {
            for (size_t idx = 0; idx < size_vec_arcs; idx++)
            {
              size_t jdx = size_vec_arcs - idx - 1;
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_x.push_back(xp[jdx]);
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_y.push_back(yp[jdx]);
            }
          }
          //do not reverse
          else
          {
            for (size_t idx = 0; idx < size_vec_arcs; idx++)
            {
              size_t jdx = idx;
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_x.push_back(xp[jdx]);
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_y.push_back(yp[jdx]);
            }
          }
          assert(xp.size() == size_vec_arcs);

        }//size_arcs
      }//size_pol
    }//"Polygon"
  }//size_geom
}